

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O1

char16_t * PAL_wcsncpy(char16_t *strDest,char16_t *strSource,size_t count)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  
  if (PAL_InitializeChakraCoreCalled) {
    uVar5 = 0;
    memset(strDest,0,(ulong)(uint)((int)count * 2));
    if (strSource != (char16_t *)0x0) {
      if (*strSource == L'\0') {
        uVar5 = 0;
      }
      else {
        uVar2 = 0;
        do {
          uVar5 = uVar2 + 1;
          lVar1 = uVar2 + 1;
          uVar2 = uVar5;
        } while (strSource[lVar1] != L'\0');
      }
    }
    sVar4 = 0;
    if (count < uVar5) {
      sVar4 = count;
    }
    if (uVar5 <= count && strSource != (char16_t *)0x0) {
      if (*strSource == L'\0') {
        sVar4 = 0;
      }
      else {
        sVar3 = 0;
        do {
          sVar4 = sVar3 + 1;
          lVar1 = sVar3 + 1;
          sVar3 = sVar4;
        } while (strSource[lVar1] != L'\0');
      }
    }
    memcpy(strDest,strSource,(ulong)(uint)((int)sVar4 * 2));
    if (PAL_InitializeChakraCoreCalled != false) {
      return strDest;
    }
  }
  abort();
}

Assistant:

char16_t *
__cdecl
PAL_wcsncpy( char16_t * strDest, const char16_t *strSource, size_t count )
{
    UINT length = sizeof( char16_t ) * count;
    PERF_ENTRY(wcsncpy);
    ENTRY("wcsncpy( strDest:%p, strSource:%p (%S), count:%lu)\n",
          strDest, strSource, strSource, (unsigned long) count);

    memset( strDest, 0, length );
    length = min( count, PAL_wcslen( strSource ) ) * sizeof( char16_t );
    memcpy( strDest, strSource, length );

    LOGEXIT("wcsncpy returning (char16_t*): %p\n", strDest);
    PERF_EXIT(wcsncpy);
    return strDest;
}